

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::COBImporter::ReadBitM_Ascii
          (COBImporter *this,Scene *param_1,LineSplitter *splitter,ChunkInfo *nfo)

{
  byte bVar1;
  LineSplitter *pLVar2;
  byte *pbVar3;
  Logger *this_00;
  range_error *this_01;
  ulong uVar5;
  int iVar6;
  byte *pbVar4;
  
  if (1 < nfo->version) {
    UnsupportedChunk_Ascii(this,splitter,nfo,"BitM");
    return;
  }
  pLVar2 = LineSplitter::operator++(splitter);
  pbVar4 = (byte *)(pLVar2->mCur)._M_dataplus._M_p;
  do {
    do {
      pbVar3 = pbVar4 + 1;
      bVar1 = *pbVar4;
      pbVar4 = pbVar3;
    } while (bVar1 == 9);
  } while (bVar1 == 0x20);
  do {
    uVar5 = (ulong)bVar1;
    if (bVar1 < 0x21) {
      if ((0x100000200U >> (uVar5 & 0x3f) & 1) != 0) {
        while (((char)uVar5 == ' ' || ((int)uVar5 == 9))) {
          bVar1 = *pbVar3;
          pbVar3 = pbVar3 + 1;
          uVar5 = (ulong)bVar1;
        }
        if (0xf5 < (byte)((char)uVar5 - 0x3aU)) {
          iVar6 = 0;
          do {
            iVar6 = (uint)(byte)((char)uVar5 - 0x30) + iVar6 * 10;
            bVar1 = *pbVar3;
            uVar5 = (ulong)bVar1;
            pbVar3 = pbVar3 + 1;
          } while (0xf5 < (byte)(bVar1 - 0x3a));
          if (iVar6 == 1) {
            return;
          }
        }
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,"Unexpected ThumbNailHdrSize, skipping this chunk");
        return;
      }
      if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) {
        this_01 = (range_error *)__cxa_allocate_exception(0x10);
        std::range_error::range_error(this_01,"Token index out of range, EOL reached");
        __cxa_throw(this_01,&std::range_error::typeinfo,std::range_error::~range_error);
      }
    }
    bVar1 = *pbVar3;
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

void COBImporter::ReadBitM_Ascii(Scene& /*out*/, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 1) {
        return UnsupportedChunk_Ascii(splitter,nfo,"BitM");
    }
/*
    "\nThumbNailHdrSize %ld"
    "\nThumbHeader: %02hx 02hx %02hx "
    "\nColorBufSize %ld"
    "\nColorBufZipSize %ld"
    "\nZippedThumbnail: %02hx 02hx %02hx "
*/

    const unsigned int head = strtoul10((++splitter)[1]);
    if (head != sizeof(Bitmap::BitmapHeader)) {
        ASSIMP_LOG_WARN("Unexpected ThumbNailHdrSize, skipping this chunk");
        return;
    }

    /*union {
        Bitmap::BitmapHeader data;
        char opaq[sizeof Bitmap::BitmapHeader()];
    };*/
//  ReadHexOctets(opaq,head,(++splitter)[1]);
}